

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcapng.c
# Opt level: O0

PCAPNG_RESULT
pcapng_create(PCAPNG_HANDLE *handle,char *filename,option_header *section_options,
             size_t section_options_space,uint16_t link_type,uint32_t snaplen,
             option_header *interface_options,size_t interface_options_space)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  section_header_block *psVar5;
  long lVar6;
  interface_description_block *piVar7;
  bool bVar8;
  uint8_t *dest;
  size_t paddedsz_1;
  interface_description_block idb;
  size_t paddedsz;
  section_header_block shb;
  size_t result;
  size_t zeroes;
  int PGSZ;
  PCAPNG_RESULT retval;
  uint32_t snaplen_local;
  uint16_t link_type_local;
  size_t section_options_space_local;
  option_header *section_options_local;
  char *filename_local;
  PCAPNG_HANDLE *handle_local;
  
  zeroes._4_4_ = PCAPNG_OK;
  iVar2 = getpagesize();
  shb.section_length = 0xffffffffffffffff;
  handle->section_header = (section_header_block *)0x0;
  handle->interface_description = (interface_description_block *)0x0;
  handle->next_interface_option_offset = 0;
  handle->interface_description_size = 0;
  handle->next_section_option_offset = 0;
  handle->section_header_size = 0;
  iVar3 = open(filename,0xc2,0x1b0);
  handle->fd = iVar3;
  if (handle->fd == -1) {
    piVar4 = __errno_location();
    switch(*piVar4) {
    case 0xc:
    case 0x1c:
      zeroes._4_4_ = PCAPNG_NO_MEMORY;
      break;
    default:
      zeroes._4_4_ = PCAPNG_FILE_NOT_ALLOWED;
      break;
    case 0x11:
      zeroes._4_4_ = PCAPNG_FILE_EXISTS;
      break;
    case 0x17:
    case 0x18:
      zeroes._4_4_ = PCAPNG_TOO_MANY_FILES_OPEN;
    }
  }
  if (zeroes._4_4_ == PCAPNG_OK) {
    paddedsz = 0x1c0a0d0d0a;
    shb.block_type = 0x1a2b3c4d;
    shb.block_total_length = 1;
    shb.byte_order_magic = 0xffffffff;
    shb.major_version = 0xffff;
    shb.minor_version = 0xffff;
    handle->section_header_size = 0x18;
    shb.section_length = write(handle->fd,&paddedsz,0x18);
    section_options_space_local = (size_t)section_options;
    while( true ) {
      bVar8 = false;
      if (((shb.section_length != 0xffffffffffffffff) &&
          (bVar8 = false, section_options_space_local != 0)) &&
         (bVar8 = false, *(short *)section_options_space_local != 0)) {
        bVar8 = *(short *)(section_options_space_local + 2) != 0;
      }
      if (!bVar8) break;
      lVar6 = (long)(int)((*(ushort *)(section_options_space_local + 2) + 3) / 4 << 2);
      uVar1 = *(ushort *)(section_options_space_local + 2);
      idb._8_8_ = lVar6;
      shb.section_length =
           write(handle->fd,(void *)section_options_space_local,
                 (long)(int)(*(ushort *)(section_options_space_local + 2) + 4));
      for (result = lVar6 - (ulong)uVar1; result != 0 && shb.section_length != 0xffffffffffffffff;
          result = result - 1) {
        shb.section_length = write(handle->fd,"",1);
      }
      section_options_space_local = section_options_space_local + idb._8_8_ + 4;
      handle->section_header_size = idb._8_8_ + 4 + handle->section_header_size;
    }
    handle->next_section_option_offset = handle->section_header_size;
  }
  if (shb.section_length == 0xffffffffffffffff) {
    zeroes._4_4_ = PCAPNG_FILE_WRITE_ERROR;
  }
  else {
    result = (long)iVar2 *
             ((handle->section_header_size + section_options_space + (long)iVar2 + 3) /
             (ulong)(long)iVar2) - handle->section_header_size;
    handle->section_header_size = result + handle->section_header_size;
    for (; result != 0 && shb.section_length != 0xffffffffffffffff; result = result - 1) {
      shb.section_length = write(handle->fd,"",1);
    }
    psVar5 = (section_header_block *)mmap((void *)0x0,handle->section_header_size,3,1,handle->fd,0);
    handle->section_header = psVar5;
  }
  if (zeroes._4_4_ == PCAPNG_OK) {
    if (shb.section_length == 0xffffffffffffffff) {
      zeroes._4_4_ = PCAPNG_FILE_WRITE_ERROR;
    }
    else if (handle->section_header == (section_header_block *)0xffffffffffffffff) {
      zeroes._4_4_ = PCAPNG_MMAP_FAILED;
    }
    else {
      paddedsz_1._0_4_ = 1;
      paddedsz_1._4_4_ = 0;
      idb.block_type._2_2_ = 0;
      handle->interface_description_size = 0x10;
      idb.block_type._0_2_ = link_type;
      idb.block_total_length = snaplen;
      shb.section_length = write(handle->fd,&paddedsz_1,0x10);
      while( true ) {
        bVar8 = false;
        if (((shb.section_length != 0xffffffffffffffff) &&
            (bVar8 = false, interface_options != (option_header *)0x0)) &&
           (bVar8 = false, interface_options->option_code != 0)) {
          bVar8 = interface_options->option_length != 0;
        }
        if (!bVar8) break;
        lVar6 = (long)(int)((interface_options->option_length + 3) / 4 << 2);
        uVar1 = interface_options->option_length;
        shb.section_length =
             write(handle->fd,interface_options,(long)(int)(interface_options->option_length + 4));
        for (result = lVar6 - (ulong)uVar1; result != 0 && shb.section_length != 0xffffffffffffffff;
            result = result - 1) {
          shb.section_length = write(handle->fd,"",1);
        }
        interface_options = (option_header *)((long)&interface_options[1].option_code + lVar6);
        handle->interface_description_size = lVar6 + 4 + handle->interface_description_size;
      }
      handle->next_interface_option_offset = handle->interface_description_size;
    }
  }
  if (zeroes._4_4_ == PCAPNG_OK) {
    if (shb.section_length == 0xffffffffffffffff) {
      zeroes._4_4_ = PCAPNG_FILE_WRITE_ERROR;
    }
    else {
      result = (long)iVar2 *
               ((handle->interface_description_size + interface_options_space + (long)iVar2 + 3) /
               (ulong)(long)iVar2) - handle->interface_description_size;
      handle->interface_description_size = result + handle->interface_description_size;
      for (; result != 0 && shb.section_length != 0xffffffffffffffff; result = result - 1) {
        shb.section_length = write(handle->fd,"",1);
      }
      piVar7 = (interface_description_block *)
               mmap((void *)0x0,handle->interface_description_size,3,1,handle->fd,
                    handle->section_header_size);
      handle->interface_description = piVar7;
    }
  }
  if (zeroes._4_4_ == PCAPNG_OK) {
    if (shb.section_length == 0xffffffffffffffff) {
      zeroes._4_4_ = PCAPNG_FILE_WRITE_ERROR;
    }
    else if (handle->interface_description == (interface_description_block *)0xffffffffffffffff) {
      zeroes._4_4_ = PCAPNG_MMAP_FAILED;
    }
    else {
      padopt.option_length =
           ((short)handle->section_header_size - (short)handle->next_section_option_offset) - 0xc;
      *(option_header *)
       ((long)&handle->section_header->block_type + handle->next_section_option_offset) = padopt;
      handle->section_header->block_total_length = (uint32_t)handle->section_header_size;
      *(int *)((long)handle->section_header + ((handle->section_header_size >> 2) - 1) * 4) =
           (int)handle->section_header_size;
      padopt.option_length =
           ((short)handle->interface_description_size - (short)handle->next_interface_option_offset)
           - 0xc;
      *(option_header *)
       ((long)&handle->interface_description->block_type + handle->next_interface_option_offset) =
           padopt;
      handle->interface_description->block_total_length =
           (uint32_t)handle->interface_description_size;
      *(int *)((long)handle->interface_description +
              ((handle->interface_description_size >> 2) - 1) * 4) =
           (int)handle->interface_description_size;
      handle->section_header->section_length = handle->interface_description_size;
    }
  }
  if (zeroes._4_4_ != PCAPNG_OK) {
    pcapng_close(handle);
  }
  return zeroes._4_4_;
}

Assistant:

PCAPNG_RESULT pcapng_create( PCAPNG_HANDLE * handle,
			     const char * filename,
			     const option_header * section_options,
			     const size_t section_options_space,
			     const uint16_t link_type,
			     const uint32_t snaplen,
			     const option_header * interface_options,
			     const size_t interface_options_space )
{
	PCAPNG_RESULT retval = PCAPNG_OK;
	int PGSZ = getpagesize( );
	size_t zeroes = 0, result = -1;

	handle->section_header = NULL;
	handle->interface_description = NULL;
	handle->section_header_size = handle->next_section_option_offset =
		handle->interface_description_size =
		handle->next_interface_option_offset = 0;

	handle->fd = open( filename, O_RDWR|O_CREAT|O_EXCL, S_IRUSR|S_IWUSR|S_IRGRP|S_IWGRP );
	if (handle->fd == -1) {
		switch( errno ) {
		case EEXIST:
			retval = PCAPNG_FILE_EXISTS;
			break;
		case EMFILE:
		case ENFILE:
			retval = PCAPNG_TOO_MANY_FILES_OPEN;
			break;
		case ENOMEM:
		case ENOSPC:
			retval = PCAPNG_NO_MEMORY;
			break;
		default:
			retval = PCAPNG_FILE_NOT_ALLOWED;
		}
	}

	if (retval == PCAPNG_OK) {
		/* section header */
		const section_header_block shb = {
			.block_type = BLOCK_TYPE_SECTION_HEADER,
			.block_total_length = 28,
			.byte_order_magic = SECTION_HEADER_BYTE_ORDER_MAGIC,
			.major_version = 1,
			.minor_version = 0,
			.section_length = (uint64_t) -1,
		};
		handle->section_header_size = sizeof( shb );
		result = write( handle->fd, &shb, sizeof( shb ) );
		/* write initial section options */
		while ((result != -1) &&
		       section_options &&
		       section_options->option_code &&
		       section_options->option_length) {
			size_t paddedsz = 4*((section_options->option_length+3)/4);
			zeroes = paddedsz - section_options->option_length;
			result = write( handle->fd, section_options, 4+section_options->option_length );
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}
			section_options = (const option_header *) &((uint8_t *)section_options)[4+paddedsz];
			handle->section_header_size += (4+paddedsz);
		}
		handle->next_section_option_offset = handle->section_header_size;
	}

	if (result == -1) {
		retval = PCAPNG_FILE_WRITE_ERROR;
	}
	else {
		/* determine the size of section header with desired space */
		zeroes = (size_t) PGSZ*((handle->section_header_size + 4 +
					 section_options_space + PGSZ - 1)/PGSZ) -
			handle->section_header_size;
		handle->section_header_size += zeroes;
		while ((zeroes > 0) && (result != -1)) {
			result = write( handle->fd, "\0", 1 );
			zeroes--;
		}

		/* mmap the section header */
		handle->section_header = mmap( NULL, handle->section_header_size, 
					       PROT_READ|PROT_WRITE,
					       MAP_SHARED,
					       handle->fd, 0 );
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->section_header == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			/* write the interface header */
			const interface_description_block idb = {
				.block_type = BLOCK_TYPE_INTERFACE,
				.block_total_length = 0,
				.link_type = link_type,
				.snaplen = snaplen
			};
			handle->interface_description_size = sizeof( idb );
			result = write( handle->fd, &idb, sizeof( idb ) );

			/* write interface options */
			while ((result != -1) &&
			       interface_options &&
			       interface_options->option_code &&
			       interface_options->option_length) {
				size_t paddedsz = 4*((interface_options->option_length+3)/4);
				zeroes = paddedsz - interface_options->option_length;
				result = write( handle->fd, interface_options, 4+interface_options->option_length );
				while ((zeroes > 0) && (result != -1)) {
					result = write( handle->fd, "\0", 1 );
					zeroes--;
				}
				interface_options = (const option_header *) &((uint8_t *)interface_options)[4+paddedsz];
				handle->interface_description_size += (4+paddedsz);
			}
			handle->next_interface_option_offset = handle->interface_description_size;
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else {
			/* determine the size of interface description with desired space */
			zeroes = (size_t) PGSZ*((handle->interface_description_size + 4 +
						 interface_options_space + PGSZ - 1)/PGSZ) -
				handle->interface_description_size;
			handle->interface_description_size += zeroes;
			while ((zeroes > 0) && (result != -1)) {
				result = write( handle->fd, "\0", 1 );
				zeroes--;
			}

			/* mmap the interface description */
			handle->interface_description = mmap( NULL, handle->interface_description_size, 
							      PROT_READ|PROT_WRITE,
							      MAP_SHARED,
							      handle->fd,
							      handle->section_header_size );
		}
	}

	if (retval == PCAPNG_OK) {
		if (result == -1) {
			retval = PCAPNG_FILE_WRITE_ERROR;
		}
		else if (handle->interface_description == MAP_FAILED) {
			retval = PCAPNG_MMAP_FAILED;
		}
		else {
			uint8_t * dest = &((uint8_t *)handle->section_header)[handle->next_section_option_offset];
			padopt.option_length = handle->section_header_size -
				handle->next_section_option_offset - 12;

			/* Add padding options, update the header sizes. */
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->section_header->block_total_length =
				(uint32_t) handle->section_header_size;
			((uint32_t*)handle->section_header)[handle->section_header_size/4-1] =
				(uint32_t) handle->section_header_size;

			padopt.option_length = handle->interface_description_size -
				handle->next_interface_option_offset - 12;
			dest = &((uint8_t *)handle->interface_description)[handle->next_interface_option_offset];
			(void) memcpy( dest, &padopt, sizeof( padopt ) );
			handle->interface_description->block_total_length =
				(uint32_t) handle->interface_description_size;
			((uint32_t*)handle->interface_description)[handle->interface_description_size/4-1] =
				(uint32_t) handle->interface_description_size;

			handle->section_header->section_length = (uint64_t) handle->interface_description_size;
		}
	}

	if (retval != PCAPNG_OK) {
		(void) pcapng_close( handle );
	}

	return retval;
}